

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetMunitionEntityIDSiteAppIncludedFlag
          (LE_Detonation_PDU *this,KBOOL F)

{
  if ((((this->m_DetonationFlag1Union).m_ui8Flag & 2) == 0) == F) {
    (this->m_DetonationFlag1Union).m_ui8Flag =
         (this->m_DetonationFlag1Union).m_ui8Flag & 0xfd | F * '\x02';
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 4 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 2;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetMunitionEntityIDSiteAppIncludedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8MunitionSiteApp )return;

    m_DetonationFlag1Union.m_ui8MunitionSiteApp = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = This flag indicates the site and application fields are included.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}